

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O2

FileName * __thiscall
embree::FileName::setExt(FileName *__return_storage_ptr__,FileName *this,string *ext)

{
  long lVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = &bStack_68;
  lVar1 = std::__cxx11::string::rfind((char)this,0x2f);
  uVar2 = std::__cxx11::string::rfind((char)this,0x2e);
  if ((uVar2 == 0xffffffffffffffff) || (uVar2 < lVar1 + 1U)) {
    std::operator+(&bStack_68,&this->filename,ext);
    FileName(__return_storage_ptr__,&bStack_68);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)this);
    std::operator+(&bStack_68,&local_48,ext);
    FileName(__return_storage_ptr__,&bStack_68);
    std::__cxx11::string::~string((string *)&bStack_68);
    this_00 = &local_48;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

FileName FileName::setExt(const std::string& ext) const {
    size_t start = filename.find_last_of(path_sep);
    if (start == std::string::npos) start = 0; else start++;
    size_t end = filename.find_last_of('.');
    if (end == std::string::npos || end < start) return FileName(filename+ext);
    return FileName(filename.substr(0,end)+ext);
  }